

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O1

void __thiscall Assimp::HMPImporter::CreateOutputFaceList(HMPImporter *this,uint width,uint height)

{
  aiMesh *paVar1;
  aiVector3D *paVar2;
  aiVector3D *paVar3;
  float fVar4;
  uint uVar5;
  int iVar6;
  ulong *puVar7;
  aiVector3D *__s;
  aiVector3D *__s_00;
  uint *puVar8;
  aiFace *paVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  aiVector3D *paVar18;
  uint uVar19;
  uint uVar20;
  aiVector3D *paVar21;
  aiFace *paVar22;
  aiVector3D *local_80;
  aiVector3D *local_68;
  
  paVar1 = *((this->super_MDLImporter).pScene)->mMeshes;
  uVar5 = width - 1;
  iVar11 = height - 1;
  uVar19 = iVar11 * uVar5;
  uVar17 = (ulong)uVar19;
  paVar1->mNumFaces = uVar19;
  puVar7 = (ulong *)operator_new__(uVar17 * 0x10 + 8);
  *puVar7 = uVar17;
  paVar22 = (aiFace *)(puVar7 + 1);
  if (uVar19 != 0) {
    paVar9 = paVar22;
    do {
      paVar9->mNumIndices = 0;
      paVar9->mIndices = (uint *)0x0;
      paVar9 = paVar9 + 1;
    } while (paVar9 != paVar22 + uVar17);
  }
  paVar1->mFaces = paVar22;
  uVar19 = paVar1->mNumFaces;
  uVar20 = uVar19 << 2;
  paVar1->mNumVertices = uVar20;
  __s = (aiVector3D *)operator_new__((ulong)uVar20 * 0xc);
  if ((uVar19 & 0x3fffffff) != 0) {
    memset(__s,0,(((ulong)uVar20 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  uVar19 = paVar1->mNumVertices;
  __s_00 = (aiVector3D *)operator_new__((ulong)uVar19 * 0xc);
  if (uVar19 != 0) {
    memset(__s_00,0,(((ulong)uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar22 = paVar1->mFaces;
  if (paVar1->mTextureCoords[0] == (aiVector3D *)0x0) {
    local_80 = (aiVector3D *)0x0;
  }
  else {
    uVar19 = paVar1->mNumVertices;
    local_80 = (aiVector3D *)operator_new__((ulong)uVar19 * 0xc);
    if (uVar19 != 0) {
      memset(local_80,0,(((ulong)uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
  }
  if (iVar11 != 0) {
    iVar13 = 0;
    iVar16 = 0;
    local_68 = local_80;
    paVar18 = __s_00;
    paVar21 = __s;
    do {
      if (uVar5 != 0) {
        iVar12 = (iVar13 + 1) * width;
        uVar17 = 0;
        do {
          iVar6 = iVar16;
          paVar22->mNumIndices = 4;
          puVar8 = (uint *)operator_new__(0x10);
          paVar22->mIndices = puVar8;
          paVar2 = paVar1->mVertices;
          iVar16 = (int)uVar17;
          uVar14 = iVar13 * width + iVar16;
          paVar3 = paVar2 + uVar14;
          fVar4 = paVar3->y;
          paVar21->x = paVar3->x;
          paVar21->y = fVar4;
          paVar21->z = paVar2[uVar14].z;
          paVar2 = paVar1->mVertices;
          uVar19 = iVar12 + iVar16;
          paVar3 = paVar2 + uVar19;
          fVar4 = paVar3->y;
          paVar21[1].x = paVar3->x;
          paVar21[1].y = fVar4;
          paVar21[1].z = paVar2[uVar19].z;
          paVar2 = paVar1->mVertices;
          uVar20 = iVar12 + 1 + iVar16;
          paVar3 = paVar2 + uVar20;
          fVar4 = paVar3->y;
          paVar21[2].x = paVar3->x;
          paVar21[2].y = fVar4;
          paVar21[2].z = paVar2[uVar20].z;
          paVar2 = paVar1->mVertices;
          uVar15 = iVar13 * width + 1 + iVar16;
          paVar3 = paVar2 + uVar15;
          fVar4 = paVar3->y;
          paVar21[3].x = paVar3->x;
          paVar21[3].y = fVar4;
          paVar21[3].z = paVar2[uVar15].z;
          paVar2 = paVar1->mNormals;
          paVar3 = paVar2 + uVar14;
          fVar4 = paVar3->y;
          paVar18->x = paVar3->x;
          paVar18->y = fVar4;
          paVar18->z = paVar2[uVar14].z;
          paVar2 = paVar1->mNormals;
          paVar3 = paVar2 + uVar19;
          fVar4 = paVar3->y;
          paVar18[1].x = paVar3->x;
          paVar18[1].y = fVar4;
          paVar18[1].z = paVar2[uVar19].z;
          paVar2 = paVar1->mNormals;
          paVar3 = paVar2 + uVar20;
          fVar4 = paVar3->y;
          paVar18[2].x = paVar3->x;
          paVar18[2].y = fVar4;
          paVar18[2].z = paVar2[uVar20].z;
          paVar2 = paVar1->mNormals;
          paVar3 = paVar2 + uVar15;
          fVar4 = paVar3->y;
          paVar18[3].x = paVar3->x;
          paVar18[3].y = fVar4;
          paVar18[3].z = paVar2[uVar15].z;
          paVar3 = paVar1->mTextureCoords[0];
          if (paVar3 != (aiVector3D *)0x0) {
            local_68->z = paVar3[uVar14].z;
            fVar4 = paVar3[uVar14].y;
            local_68->x = paVar3[uVar14].x;
            local_68->y = fVar4;
            paVar3 = paVar1->mTextureCoords[0];
            local_68[1].z = paVar3[uVar19].z;
            paVar3 = paVar3 + uVar19;
            fVar4 = paVar3->y;
            local_68[1].x = paVar3->x;
            local_68[1].y = fVar4;
            paVar3 = paVar1->mTextureCoords[0];
            local_68[2].z = paVar3[uVar20].z;
            paVar3 = paVar3 + uVar20;
            fVar4 = paVar3->y;
            local_68[2].x = paVar3->x;
            local_68[2].y = fVar4;
            paVar3 = paVar1->mTextureCoords[0];
            local_68[3].z = paVar3[uVar15].z;
            paVar3 = paVar3 + uVar15;
            fVar4 = paVar3->y;
            local_68[3].x = paVar3->x;
            local_68[3].y = fVar4;
            local_68 = local_68 + 4;
          }
          paVar21 = paVar21 + 4;
          paVar18 = paVar18 + 4;
          lVar10 = 0;
          do {
            paVar22->mIndices[lVar10] = iVar6 + (int)lVar10;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          uVar17 = uVar17 + 1;
          paVar22 = paVar22 + 1;
          iVar16 = iVar6 + 4;
        } while (uVar17 != uVar5);
        iVar16 = iVar6 + 4;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != iVar11);
  }
  if (paVar1->mVertices != (aiVector3D *)0x0) {
    operator_delete__(paVar1->mVertices);
  }
  paVar1->mVertices = __s;
  if (paVar1->mNormals != (aiVector3D *)0x0) {
    operator_delete__(paVar1->mNormals);
  }
  paVar1->mNormals = __s_00;
  if (paVar1->mTextureCoords[0] != (aiVector3D *)0x0) {
    operator_delete__(paVar1->mTextureCoords[0]);
    paVar1->mTextureCoords[0] = local_80;
  }
  return;
}

Assistant:

void HMPImporter::CreateOutputFaceList(unsigned int width,unsigned int height)
{
    aiMesh* const pcMesh = this->pScene->mMeshes[0];

    // Allocate enough storage
    pcMesh->mNumFaces = (width-1) * (height-1);
    pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

    pcMesh->mNumVertices   = pcMesh->mNumFaces*4;
    aiVector3D* pcVertices = new aiVector3D[pcMesh->mNumVertices];
    aiVector3D* pcNormals  = new aiVector3D[pcMesh->mNumVertices];

    aiFace* pcFaceOut(pcMesh->mFaces);
    aiVector3D* pcVertOut = pcVertices;
    aiVector3D* pcNorOut = pcNormals;

    aiVector3D* pcUVs = pcMesh->mTextureCoords[0] ? new aiVector3D[pcMesh->mNumVertices] : NULL;
    aiVector3D* pcUVOut(pcUVs);

    // Build the terrain square
    unsigned int iCurrent = 0;
    for (unsigned int y = 0; y < height-1;++y)  {
        for (unsigned int x = 0; x < width-1;++x,++pcFaceOut)   {
            pcFaceOut->mNumIndices = 4;
            pcFaceOut->mIndices = new unsigned int[4];

            *pcVertOut++ = pcMesh->mVertices[y*width+x];
            *pcVertOut++ = pcMesh->mVertices[(y+1)*width+x];
            *pcVertOut++ = pcMesh->mVertices[(y+1)*width+x+1];
            *pcVertOut++ = pcMesh->mVertices[y*width+x+1];


            *pcNorOut++ = pcMesh->mNormals[y*width+x];
            *pcNorOut++ = pcMesh->mNormals[(y+1)*width+x];
            *pcNorOut++ = pcMesh->mNormals[(y+1)*width+x+1];
            *pcNorOut++ = pcMesh->mNormals[y*width+x+1];

            if (pcMesh->mTextureCoords[0])
            {
                *pcUVOut++ = pcMesh->mTextureCoords[0][y*width+x];
                *pcUVOut++ = pcMesh->mTextureCoords[0][(y+1)*width+x];
                *pcUVOut++ = pcMesh->mTextureCoords[0][(y+1)*width+x+1];
                *pcUVOut++ = pcMesh->mTextureCoords[0][y*width+x+1];
            }

            for (unsigned int i = 0; i < 4;++i)
                pcFaceOut->mIndices[i] = iCurrent++;
        }
    }
    delete[] pcMesh->mVertices;
    pcMesh->mVertices = pcVertices;

    delete[] pcMesh->mNormals;
    pcMesh->mNormals = pcNormals;

    if (pcMesh->mTextureCoords[0])
    {
        delete[] pcMesh->mTextureCoords[0];
        pcMesh->mTextureCoords[0] = pcUVs;
    }
}